

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  TestError *pTVar2;
  undefined1 *local_a8;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string shader_source;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_28;
  _supported_variable_types_map_const_iterator var_iterator;
  int var_type_index;
  int num_var_types;
  TestShaderType tested_shader_type_local;
  ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  var_iterator._M_node._4_4_ = 0;
  while( true ) {
    if (0x1b < var_iterator._M_node._4_4_) {
      return;
    }
    local_30._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                (key_type *)(Interface::ES::var_types + (long)var_iterator._M_node._4_4_ * 4));
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_28,&local_30);
    shader_source.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_38,(iterator *)((long)&shader_source.field_2 + 8));
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"struct light {\n    float intensity;\n    int position;\n};\n\n",
               &local_61);
    std::allocator<char>::~allocator(&local_61);
    std::__cxx11::string::operator+=((string *)local_60,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)local_60,"    light[][] x =");
    std::__cxx11::string::operator+=((string *)local_60,"light");
    std::__cxx11::string::operator+=((string *)local_60,"[][](");
    std::__cxx11::string::operator+=((string *)local_60,"light");
    std::__cxx11::string::operator+=((string *)local_60,"[](light(1.0, 1)),");
    std::__cxx11::string::operator+=((string *)local_60,"light");
    std::__cxx11::string::operator+=((string *)local_60,"[](light(2.0, 2)));\n\n");
    std::__cxx11::string::operator+=((string *)local_60,"    light[][] y =");
    std::__cxx11::string::operator+=((string *)local_60,"light");
    std::__cxx11::string::operator+=((string *)local_60,"[][](");
    std::__cxx11::string::operator+=((string *)local_60,"light");
    std::__cxx11::string::operator+=((string *)local_60,"[](light(3.0, 3)),");
    std::__cxx11::string::operator+=((string *)local_60,"light");
    std::__cxx11::string::operator+=((string *)local_60,"[](light(4.0, 4)));\n\n");
    std::__cxx11::string::operator+=((string *)local_60,"    float result = 0.0;\n\n");
    std::__cxx11::string::operator+=((string *)local_60,"    if (x == y)\n");
    std::__cxx11::string::operator+=((string *)local_60,"    {\n");
    std::__cxx11::string::operator+=((string *)local_60,"        result = 1.0;\n");
    std::__cxx11::string::operator+=((string *)local_60,"    }\n");
    std::__cxx11::string::operator+=((string *)local_60,"    if (y != x)\n");
    std::__cxx11::string::operator+=((string *)local_60,"    {\n");
    std::__cxx11::string::operator+=((string *)local_60,"        result = 2.0;\n");
    std::__cxx11::string::operator+=((string *)local_60,"    }\n");
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_60,"\n    gl_FragDepth = result;\n");
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)local_60,"\n    gl_Position = vec4(0.0,0.0,0.0,1.0);\n");
      break;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_60,(string *)emit_quad_abi_cxx11_);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_60,(string *)set_tesseation_abi_cxx11_);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xdfc);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_60,(string *)shader_end_abi_cxx11_);
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    local_a8 = default_fragment_shader_source_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      local_a8 = local_60;
      break;
    case VERTEX_SHADER_TYPE:
      tcs = (string *)local_60;
      break;
    case COMPUTE_SHADER_TYPE:
      tcs = (string *)empty_string_abi_cxx11_;
      local_a8 = empty_string_abi_cxx11_;
      break;
    case GEOMETRY_SHADER_TYPE:
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xe04);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[9])(this,tcs,local_a8,1,0);
    std::__cxx11::string::~string((string *)local_60);
    var_iterator._M_node._4_4_ = var_iterator._M_node._4_4_ + 1;
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xe08);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ExpressionsEquality2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = "struct light {\n    float intensity;\n    int position;\n};\n\n";

			shader_source += shader_start;
			shader_source += "    light[][] x =";
			shader_source += "light";
			shader_source += "[][](";
			shader_source += "light";
			shader_source += "[](light(1.0, 1)),";
			shader_source += "light";
			shader_source += "[](light(2.0, 2)));\n\n";
			shader_source += "    light[][] y =";
			shader_source += "light";
			shader_source += "[][](";
			shader_source += "light";
			shader_source += "[](light(3.0, 3)),";
			shader_source += "light";
			shader_source += "[](light(4.0, 4)));\n\n";
			shader_source += "    float result = 0.0;\n\n";
			shader_source += "    if (x == y)\n";
			shader_source += "    {\n";
			shader_source += "        result = 1.0;\n";
			shader_source += "    }\n";
			shader_source += "    if (y != x)\n";
			shader_source += "    {\n";
			shader_source += "        result = 2.0;\n";
			shader_source += "    }\n";

			/* Apply stage specific stuff */
			switch (tested_shader_type)
			{
			case TestCaseBase<API>::VERTEX_SHADER_TYPE:
				shader_source += "\n    gl_Position = vec4(0.0,0.0,0.0,1.0);\n";
				break;
			case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
				shader_source += "\n    gl_FragDepth = result;\n";
				break;
			case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				break;
			case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				shader_source += emit_quad;
				break;
			case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
				shader_source += set_tesseation;
				break;
			case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
				break;
			default:
				TCU_FAIL("Unrecognized shader type.");
				break;
			}

			/* End main function */
			shader_source += shader_end;

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}